

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escaping.cc
# Opt level: O0

size_t absl::lts_20240722::strings_internal::Base64EscapeInternal
                 (uchar *src,size_t szsrc,char *dest,size_t szdest,char *base64,bool do_padding)

{
  byte bVar1;
  uchar *puVar2;
  uint16_t uVar3;
  uint32_t uVar4;
  uint uVar5;
  char *pcVar6;
  char *absl_raw_log_internal_basename;
  uint32_t in_3;
  uint32_t in_2;
  uint32_t in_1;
  uint32_t in;
  uchar *limit_src;
  char *limit_dest;
  uchar *cur_src;
  char *cur_dest;
  bool do_padding_local;
  char *base64_local;
  size_t szdest_local;
  char *dest_local;
  size_t szsrc_local;
  uchar *src_local;
  
  if (szdest * 3 < szsrc << 2) {
    src_local = (uchar *)0x0;
  }
  else {
    limit_dest = (char *)src;
    cur_src = (uchar *)dest;
    if (2 < szsrc) {
      for (; limit_dest < src + (szsrc - 3); limit_dest = limit_dest + 3) {
        uVar4 = big_endian::Load32(limit_dest);
        uVar5 = uVar4 >> 8;
        *cur_src = base64[uVar4 >> 0x1a];
        cur_src[1] = base64[(uVar5 & 0x3ffff) >> 0xc];
        cur_src[2] = base64[(uVar5 & 0xfff) >> 6];
        cur_src[3] = base64[uVar5 & 0x3f];
        cur_src = cur_src + 4;
      }
    }
    pcVar6 = dest + (szdest - (long)cur_src);
    switch(src + (szsrc - (long)limit_dest)) {
    case (uchar *)0x0:
      puVar2 = cur_src;
      break;
    case (uchar *)0x1:
      if (pcVar6 < (char *)0x2) {
        return 0;
      }
      bVar1 = *limit_dest;
      *cur_src = base64[bVar1 >> 2];
      cur_src[1] = base64[(bVar1 & 3) << 4];
      puVar2 = cur_src + 2;
      if (do_padding) {
        if (pcVar6 + -2 < (char *)0x2) {
          return 0;
        }
        cur_src[2] = '=';
        cur_src[3] = '=';
        puVar2 = cur_src + 4;
      }
      break;
    case (uchar *)0x2:
      if (pcVar6 < (char *)0x3) {
        return 0;
      }
      uVar3 = big_endian::Load16(limit_dest);
      *cur_src = base64[uVar3 >> 10];
      cur_src[1] = base64[(uVar3 & 0x3ff) >> 4];
      cur_src[2] = base64[(uVar3 & 0xf) << 2];
      puVar2 = cur_src + 3;
      if (do_padding) {
        if (pcVar6 == (char *)0x3) {
          return 0;
        }
        cur_src[3] = '=';
        puVar2 = cur_src + 4;
      }
      break;
    case (uchar *)0x3:
      if (pcVar6 < (char *)0x4) {
        return 0;
      }
      bVar1 = *limit_dest;
      uVar3 = big_endian::Load16(limit_dest + 1);
      uVar5 = (uint)bVar1 * 0x10000 + (uint)uVar3;
      *cur_src = base64[uVar5 >> 0x12];
      cur_src[1] = base64[(uVar5 & 0x3ffff) >> 0xc];
      cur_src[2] = base64[(uVar5 & 0xfff) >> 6];
      cur_src[3] = base64[uVar5 & 0x3f];
      puVar2 = cur_src + 4;
      break;
    default:
      absl::lts_20240722::raw_log_internal::RawLog
                (kFatal,"escaping.cc",0xc9,"Logic problem? szsrc = %zu",
                 src + (szsrc - (long)limit_dest));
      __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/absl-src/absl/strings/internal/escaping.cc"
                    ,0xc9,
                    "size_t absl::strings_internal::Base64EscapeInternal(const unsigned char *, size_t, char *, size_t, const char *, bool)"
                   );
    }
    cur_src = puVar2;
    src_local = cur_src + -(long)dest;
  }
  return (size_t)src_local;
}

Assistant:

size_t Base64EscapeInternal(const unsigned char* src, size_t szsrc, char* dest,
                            size_t szdest, const char* base64,
                            bool do_padding) {
  static const char kPad64 = '=';

  if (szsrc * 4 > szdest * 3) return 0;

  char* cur_dest = dest;
  const unsigned char* cur_src = src;

  char* const limit_dest = dest + szdest;
  const unsigned char* const limit_src = src + szsrc;

  // (from https://tools.ietf.org/html/rfc3548)
  // Special processing is performed if fewer than 24 bits are available
  // at the end of the data being encoded.  A full encoding quantum is
  // always completed at the end of a quantity.  When fewer than 24 input
  // bits are available in an input group, zero bits are added (on the
  // right) to form an integral number of 6-bit groups.
  //
  // If do_padding is true, padding at the end of the data is performed. This
  // output padding uses the '=' character.

  // Three bytes of data encodes to four characters of cyphertext.
  // So we can pump through three-byte chunks atomically.
  if (szsrc >= 3) {                    // "limit_src - 3" is UB if szsrc < 3.
    while (cur_src < limit_src - 3) {  // While we have >= 32 bits.
      uint32_t in = absl::big_endian::Load32(cur_src) >> 8;

      cur_dest[0] = base64[in >> 18];
      in &= 0x3FFFF;
      cur_dest[1] = base64[in >> 12];
      in &= 0xFFF;
      cur_dest[2] = base64[in >> 6];
      in &= 0x3F;
      cur_dest[3] = base64[in];

      cur_dest += 4;
      cur_src += 3;
    }
  }
  // To save time, we didn't update szdest or szsrc in the loop.  So do it now.
  szdest = static_cast<size_t>(limit_dest - cur_dest);
  szsrc = static_cast<size_t>(limit_src - cur_src);

  /* now deal with the tail (<=3 bytes) */
  switch (szsrc) {
    case 0:
      // Nothing left; nothing more to do.
      break;
    case 1: {
      // One byte left: this encodes to two characters, and (optionally)
      // two pad characters to round out the four-character cypherblock.
      if (szdest < 2) return 0;
      uint32_t in = cur_src[0];
      cur_dest[0] = base64[in >> 2];
      in &= 0x3;
      cur_dest[1] = base64[in << 4];
      cur_dest += 2;
      szdest -= 2;
      if (do_padding) {
        if (szdest < 2) return 0;
        cur_dest[0] = kPad64;
        cur_dest[1] = kPad64;
        cur_dest += 2;
        szdest -= 2;
      }
      break;
    }
    case 2: {
      // Two bytes left: this encodes to three characters, and (optionally)
      // one pad character to round out the four-character cypherblock.
      if (szdest < 3) return 0;
      uint32_t in = absl::big_endian::Load16(cur_src);
      cur_dest[0] = base64[in >> 10];
      in &= 0x3FF;
      cur_dest[1] = base64[in >> 4];
      in &= 0x00F;
      cur_dest[2] = base64[in << 2];
      cur_dest += 3;
      szdest -= 3;
      if (do_padding) {
        if (szdest < 1) return 0;
        cur_dest[0] = kPad64;
        cur_dest += 1;
        szdest -= 1;
      }
      break;
    }
    case 3: {
      // Three bytes left: same as in the big loop above.  We can't do this in
      // the loop because the loop above always reads 4 bytes, and the fourth
      // byte is past the end of the input.
      if (szdest < 4) return 0;
      uint32_t in =
          (uint32_t{cur_src[0]} << 16) + absl::big_endian::Load16(cur_src + 1);
      cur_dest[0] = base64[in >> 18];
      in &= 0x3FFFF;
      cur_dest[1] = base64[in >> 12];
      in &= 0xFFF;
      cur_dest[2] = base64[in >> 6];
      in &= 0x3F;
      cur_dest[3] = base64[in];
      cur_dest += 4;
      szdest -= 4;
      break;
    }
    default:
      // Should not be reached: blocks of 4 bytes are handled
      // in the while loop before this switch statement.
      ABSL_RAW_LOG(FATAL, "Logic problem? szsrc = %zu", szsrc);
      break;
  }
  return static_cast<size_t>(cur_dest - dest);
}